

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDEdgePtr __thiscall
ON_SubD_FixedSizeHeap::FindOrAllocateEdge
          (ON_SubD_FixedSizeHeap *this,ON_SubDVertex *v0,double v0_sector_coefficient,
          ON_SubDVertex *v1,double v1_sector_coefficient)

{
  ON_SubDVertex *pOVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDEdgePtr OVar3;
  ulong uVar4;
  ON_SubDEdgePtr ep;
  ON_SubDEdgePtr local_48;
  double local_40;
  double local_38;
  
  if ((((v0 == (ON_SubDVertex *)0x0) || (v0->m_edges == (ON_SubDEdgePtr *)0x0)) ||
      (v1 == (ON_SubDVertex *)0x0)) || (v1->m_edges == (ON_SubDEdgePtr *)0x0)) {
    ON_SubDIncrementErrorCount();
    OVar3 = (ON_SubDEdgePtr)0;
  }
  else {
    local_40 = v0_sector_coefficient;
    local_38 = v1_sector_coefficient;
    if (v0->m_edge_count != 0) {
      uVar4 = 0;
      do {
        local_48.m_ptr = v0->m_edges[uVar4].m_ptr;
        pOVar1 = ON_SubDEdgePtr::RelativeVertex(&local_48,0);
        pOVar2 = ON_SubDEdgePtr::RelativeVertex(&local_48,1);
        if (pOVar1 == v0) {
          if (pOVar2 == v1) {
            return (ON_SubDEdgePtr)local_48.m_ptr;
          }
        }
        else if (pOVar2 == v0) {
          pOVar1 = ON_SubDEdgePtr::RelativeVertex(&local_48,0);
          if (pOVar1 == v1) {
            OVar3 = ON_SubDEdgePtr::Reversed(&local_48);
            return (ON_SubDEdgePtr)OVar3.m_ptr;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < v0->m_edge_count);
    }
    OVar3 = AllocateEdge(this,v0,local_40,v1,local_38);
  }
  return (ON_SubDEdgePtr)OVar3.m_ptr;
}

Assistant:

const ON_SubDEdgePtr ON_SubD_FixedSizeHeap::FindOrAllocateEdge(
  ON_SubDVertex * v0,
  double v0_sector_coefficient,
  ON_SubDVertex * v1,
  double v1_sector_coefficient
)
{
  if ( nullptr == v0 || nullptr == v0->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if ( nullptr == v1 || nullptr == v1->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  for (unsigned short v0ei = 0; v0ei < v0->m_edge_count; ++v0ei)
  {
    const ON_SubDEdgePtr ep = v0->m_edges[v0ei];
    if (v0 == ep.RelativeVertex(0))
    {
      if (v1 == ep.RelativeVertex(1))
        return ep;
    }
    else if (v0 == ep.RelativeVertex(1))
    {
      if (v1 == ep.RelativeVertex(0))
        return ep.Reversed();
    }
    else
    {
      ON_SUBD_RETURN_ERROR("Invalid ON_SubDEdgePtr in vertex->m_edge[] array");
    }
  }

  return AllocateEdge(v0, v0_sector_coefficient, v1, v1_sector_coefficient);
}